

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmap.cpp
# Opt level: O0

int map_height_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  int rank;
  Am_Object *self_local;
  
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)STAGGER);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  if (bVar1) {
    pAVar3 = (Am_Value *)Am_Object::Get((ushort)self,0x85);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    if (iVar2 % 2 == 0) {
      self_local._4_4_ = 0x19;
    }
    else {
      self_local._4_4_ = 0x23;
    }
  }
  else {
    self_local._4_4_ = 0x1e;
  }
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, map_height)
{
  if ((bool)self.Get(STAGGER)) {
    int rank = self.Get(Am_RANK);
    if (rank % 2)
      return 35;
    else
      return 25;
  } else
    return 30;
}